

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets.c
# Opt level: O0

int socket_buffer_size(int socket_fd,Direction direction)

{
  int __optname;
  int in_ESI;
  int in_EDI;
  socklen_t value_size;
  int buffer_size;
  int return_code;
  socklen_t local_14;
  int local_10;
  int local_c;
  
  local_14 = 4;
  __optname = 8;
  if (in_ESI == 0) {
    __optname = 7;
  }
  local_c = getsockopt(in_EDI,1,__optname,&local_10,&local_14);
  if (local_c == -1) {
    throw((char *)0x102c17);
  }
  return local_10;
}

Assistant:

int socket_buffer_size(int socket_fd, Direction direction) {
	int return_code;
	int buffer_size;
	socklen_t value_size = sizeof buffer_size;

	// clang-format off
	return_code = getsockopt(
		socket_fd,
		SOL_SOCKET,
		(direction == SEND) ? SO_SNDBUF : SO_RCVBUF,
		&buffer_size,
		&value_size
	);
	// clang-format on

	if (return_code == -1) {
		throw("Error getting buffer size");
	}

	return buffer_size;
}